

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_file_from_disk.unit.cpp
# Opt level: O2

void __thiscall
TestLoadJSONFromDisk_TestMissingJSONFile_Test::TestBody
          (TestLoadJSONFromDisk_TestMissingJSONFile_Test *this)

{
  bool bVar1;
  ScopedTrace gtest_trace_128;
  AssertHelper local_9c8;
  string local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  path clear_3_path;
  ProductData local_958;
  
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x80,"Begin Test: Load missing file from disk.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&clear_3_path,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::operator/=(&clear_3_path,(char (*) [18])0x17fede);
  std::filesystem::__cxx11::path::operator/=(&clear_3_path,(char (*) [22])"igsdb_v1_clear_3.json");
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  local_9a0.field_2._M_allocated_capacity = 0;
  local_9a0.field_2._8_8_ = 0;
  local_9a0._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::filesystem::__cxx11::path::string(&local_9c0,&clear_3_path);
    OpticsParser::parseJSONFile(&local_958,&local_9c0);
    OpticsParser::ProductData::~ProductData(&local_958);
    std::__cxx11::string::~string((string *)&local_9c0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&local_9a0,
             "Expected: OpticsParser::parseJSONFile(clear_3_path.string()) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::Message::Message((Message *)&local_9c0);
  testing::internal::AssertHelper::AssertHelper
            (&local_9c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x86,local_9a0._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_9c8,(Message *)&local_9c0);
  testing::internal::AssertHelper::~AssertHelper(&local_9c8);
  if ((long *)local_9c0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_9c0._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&local_9a0);
  std::filesystem::__cxx11::path::~path(&clear_3_path);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_128);
  return;
}

Assistant:

TEST(TestLoadJSONFromDisk, TestMissingJSONFile)
{
    SCOPED_TRACE("Begin Test: Load missing file from disk.");

    std::filesystem::path clear_3_path(TEST_DATA_DIR);
    clear_3_path /= "some_invalid_path";
    clear_3_path /= "igsdb_v1_clear_3.json";

    EXPECT_THROW(OpticsParser::parseJSONFile(clear_3_path.string()), std::runtime_error);
}